

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::PathPtr::eval(Path *__return_storage_ptr__,PathPtr *this,StringPtr pathText)

{
  String *pSVar1;
  RemoveConst<kj::String> *pRVar2;
  String *pSVar3;
  char *pcVar4;
  Vector<kj::String> *parts;
  char *size;
  char *value;
  size_t newSize;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  StringPtr path;
  StringPtr path_00;
  Vector<kj::String> newParts;
  Vector<kj::String> local_78;
  char *local_58;
  Path *local_50;
  String local_48;
  
  path_00.content.ptr = (char *)pathText.content.size_;
  parts = (Vector<kj::String> *)pathText.content.ptr;
  if ((path_00.content.ptr < (char *)0x2) || (*(char *)&(parts->builder).ptr != '/')) {
    if ((Vector<kj::String> *)(path_00.content.ptr + (long)((long)&parts[-1].builder.disposer + 7))
        == parts) {
      lVar7 = 1;
    }
    else {
      lVar7 = 1;
      pcVar4 = (char *)0x0;
      do {
        lVar7 = lVar7 + (ulong)(pcVar4[(long)&parts->builder] == '/');
        pcVar4 = pcVar4 + 1;
      } while (path_00.content.ptr + -1 != pcVar4);
    }
    sVar6 = lVar7 + (this->parts).size_;
    sVar5 = 0;
    local_58 = path_00.content.ptr;
    local_50 = __return_storage_ptr__;
    local_78.builder.ptr =
         (String *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x18,0,sVar6,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_78.builder.endPtr = local_78.builder.ptr + sVar6;
    local_78.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sVar6 = (this->parts).size_;
    local_78.builder.pos = local_78.builder.ptr;
    if (sVar6 != 0) {
      pSVar1 = (this->parts).ptr;
      lVar7 = 0;
      do {
        pcVar4 = *(char **)((long)&(pSVar1->content).size_ + lVar7);
        value = pcVar4;
        if (pcVar4 != (char *)0x0) {
          value = *(char **)((long)&(pSVar1->content).ptr + lVar7);
        }
        size = (char *)0x0;
        if (pcVar4 != (char *)0x0) {
          size = pcVar4 + -1;
        }
        heapString(&local_48,value,(size_t)size);
        if (local_78.builder.pos == local_78.builder.endPtr) {
          newSize = ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) *
                    0x5555555555555556;
          if (local_78.builder.pos == local_78.builder.ptr) {
            newSize = 4;
          }
          Vector<kj::String>::setCapacity(&local_78,newSize);
        }
        ((local_78.builder.pos)->content).ptr = local_48.content.ptr;
        ((local_78.builder.pos)->content).size_ = local_48.content.size_;
        ((local_78.builder.pos)->content).disposer = local_48.content.disposer;
        local_78.builder.pos = local_78.builder.pos + 1;
        lVar7 = lVar7 + 0x18;
      } while (sVar6 * 0x18 != lVar7);
    }
    __return_storage_ptr__ = local_50;
    path.content.size_ = sVar5;
    path.content.ptr = local_58;
    Path::evalImpl(local_50,(Path *)&local_78,parts,path);
  }
  else {
    if ((Vector<kj::String> *)(path_00.content.ptr + (long)((long)&parts[-1].builder.disposer + 7))
        == parts) {
      sVar6 = 1;
    }
    else {
      sVar6 = 1;
      pcVar4 = (char *)0x0;
      do {
        sVar6 = sVar6 + (pcVar4[(long)&parts->builder] == '/');
        pcVar4 = pcVar4 + 1;
      } while (path_00.content.ptr + -1 != pcVar4);
    }
    sVar5 = 0;
    local_78.builder.ptr =
         (String *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x18,0,sVar6,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_78.builder.endPtr = local_78.builder.ptr + sVar6;
    local_78.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    path_00.content.size_ = sVar5;
    local_78.builder.pos = local_78.builder.ptr;
    Path::evalImpl(__return_storage_ptr__,(Path *)&local_78,parts,path_00);
  }
  pSVar3 = local_78.builder.endPtr;
  pRVar2 = local_78.builder.pos;
  pSVar1 = local_78.builder.ptr;
  if (local_78.builder.ptr != (String *)0x0) {
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_78.builder.endPtr = (String *)0x0;
    (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
              (local_78.builder.disposer,pSVar1,0x18,
               ((long)pRVar2 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ((long)pSVar3 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::eval(StringPtr pathText) const {
  if (pathText.startsWith("/")) {
    // Optimization: avoid copying parts that will just be dropped.
    return Path::evalImpl(Vector<String>(Path::countParts(pathText)), pathText);
  } else {
    Vector<String> newParts(parts.size() + Path::countParts(pathText));
    for (auto& p: parts) newParts.add(heapString(p));
    return Path::evalImpl(kj::mv(newParts), pathText);
  }
}